

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

void __thiscall
Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
          (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this,
          MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *factors)

{
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_RSI;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_RDI;
  undefined8 in_stack_ffffffffffffff98;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  *in_stack_ffffffffffffffa0;
  Numeral *in_stack_ffffffffffffffa8;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffffb0;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffffc8;
  
  IntegerConstantType::IntegerConstantType
            ((IntegerConstantType *)in_stack_ffffffffffffffa0,
             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactors(in_RSI,in_RDI);
  Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
            (in_stack_ffffffffffffffc8);
  Monom(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~MonomFactors
            ((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x3731cf);
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x3731d9);
  return;
}

Assistant:

Monom(MonomFactors<Number> factors) : Monom(Numeral(1), perfect(std::move(factors))) {}